

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glfontstash.h
# Opt level: O1

int glfonsRasterize(FONScontext *ctx,fsuint textId,char *s,uint color)

{
  uint *puVar1;
  undefined2 uVar2;
  uint uVar3;
  long *plVar4;
  FONSshaping *pFVar5;
  mapped_type pGVar6;
  mapped_type *ppGVar7;
  mapped_type pGVar8;
  size_t sVar9;
  mapped_type *ppGVar10;
  short sVar11;
  pointer pfVar12;
  size_t sVar13;
  mapped_type pGVar14;
  int iVar15;
  ulong uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  fsuint local_4c;
  mapped_type local_48;
  long *local_40;
  value_type_conflict1 local_34;
  
  plVar4 = (long *)(ctx->params).userPtr;
  local_4c = textId;
  if (*(int *)((long)plVar4 + 0x54) == 0) {
    pGVar14 = (mapped_type)0x0;
  }
  else {
    ppGVar7 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_GLFONSbuffer_*>,_std::allocator<std::pair<const_unsigned_int,_GLFONSbuffer_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_GLFONSbuffer_*>,_std::allocator<std::pair<const_unsigned_int,_GLFONSbuffer_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)(plVar4 + 0x16),(key_type *)((long)plVar4 + 0x54));
    pGVar14 = *ppGVar7;
  }
  fVar17 = fonsDrawText(ctx,0.0,0.0,s,(char *)0x0,'\0');
  if ((int)fVar17 == -1) {
    iVar15 = 1;
  }
  else {
    pGVar8 = (mapped_type)operator_new(0x20);
    uVar16 = (long)(pGVar14->interleavedArray).super__Vector_base<float,_std::allocator<float>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pGVar14->interleavedArray).super__Vector_base<float,_std::allocator<float>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    pGVar8->offset = (long)uVar16 >> 2;
    iVar15 = (int)(uVar16 >> 2);
    local_34 = 0.0;
    local_48 = pGVar14;
    local_40 = plVar4;
    std::vector<float,_std::allocator<float>_>::resize
              (&pGVar14->interleavedArray,(long)ctx->nverts * *plVar4 + (long)iVar15,&local_34);
    plVar4 = local_40;
    pGVar6 = local_48;
    uVar3 = ctx->nverts;
    if ((int)uVar3 < 1) {
      fVar21 = -INFINITY;
      fVar25 = INFINITY;
      fVar19 = -INFINITY;
      fVar23 = INFINITY;
    }
    else {
      pfVar12 = (pGVar14->interleavedArray).super__Vector_base<float,_std::allocator<float>_>.
                _M_impl.super__Vector_impl_data._M_start + (long)iVar15 + 3;
      uVar16 = 0;
      fVar18 = -INFINITY;
      fVar20 = -INFINITY;
      fVar22 = INFINITY;
      fVar24 = INFINITY;
      do {
        fVar19 = ctx->verts[uVar16];
        fVar21 = ctx->verts[uVar16 + 1];
        fVar23 = fVar19;
        if (fVar22 <= fVar19) {
          fVar23 = fVar22;
        }
        fVar25 = fVar21;
        if (fVar24 <= fVar21) {
          fVar25 = fVar24;
        }
        pfVar12[-3] = fVar19;
        if (fVar19 <= fVar18) {
          fVar19 = fVar18;
        }
        pfVar12[-2] = fVar21;
        if (fVar21 <= fVar20) {
          fVar21 = fVar20;
        }
        pfVar12[-1] = ctx->tcoords[uVar16];
        *pfVar12 = ctx->tcoords[uVar16 + 1];
        uVar16 = uVar16 + 2;
        pfVar12 = pfVar12 + 8;
        fVar18 = fVar19;
        fVar20 = fVar21;
        fVar22 = fVar23;
        fVar24 = fVar25;
      } while (uVar16 < (ulong)uVar3 * 2);
      fVar23 = fVar23 + 3.0;
      fVar25 = fVar25 + -3.0;
      fVar19 = fVar19 + 3.0;
      fVar21 = fVar21 + -3.0;
    }
    pGVar8->bbox[0] = fVar23;
    pGVar8->bbox[1] = fVar25;
    pGVar8->bbox[2] = fVar19;
    pGVar8->bbox[3] = fVar21;
    pGVar8->length = (float)((int)fVar17 + -6);
    pFVar5 = ctx->shaping;
    if ((pFVar5 == (FONSshaping *)0x0) ||
       (iVar15 = ctx->nstates, ctx->states[(long)iVar15 + -1].useShaping == 0)) {
      sVar9 = strlen(s);
      sVar11 = 0;
      if (sVar9 != 0) {
        sVar13 = 0;
        uVar16 = 0;
        sVar11 = 0;
        do {
          uVar16 = (ulong)(byte)fons__decutf8(unsigned_int*,unsigned_int*,unsigned_int)::utf8d
                                [(byte)fons__decutf8(unsigned_int*,unsigned_int*,unsigned_int)::
                                       utf8d[(byte)s[sVar13]] + uVar16 + 0x100];
          sVar11 = sVar11 + (ushort)(uVar16 == 0);
          sVar13 = sVar13 + 1;
        } while (sVar9 != sVar13);
      }
      pGVar8->nbGlyph = sVar11;
    }
    else {
      pGVar8->nbGlyph = (short)pFVar5->result->glyphCount;
      pFVar5->it = -1;
      ctx->states[(long)iVar15 + -1].useShaping = 0;
    }
    uVar2 = pGVar8->nbGlyph;
    pGVar8->padding = uVar2 * (short)(int)*plVar4 * 6;
    puVar1 = &pGVar6->nVerts;
    *puVar1 = *puVar1 + uVar3;
    ctx->nverts = 0;
    ppGVar10 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_GLFONSstash_*>,_std::allocator<std::pair<const_unsigned_int,_GLFONSstash_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_GLFONSstash_*>,_std::allocator<std::pair<const_unsigned_int,_GLFONSstash_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&pGVar6->stashes,&local_4c);
    *ppGVar10 = pGVar8;
    iVar15 = 0;
  }
  return iVar15;
}

Assistant:

int glfonsRasterize(FONScontext* ctx, fsuint textId, const char* s, unsigned int color) {
    (void) color;
    GLFONScontext* gl = (GLFONScontext*) ctx->params.userPtr;
    GLFONSbuffer* buffer = glfons__bufferBound(gl);

    int length = fonsDrawText(ctx, 0, 0, s, NULL, 0);

    if (length == -1.f) {
        return GLFONS_INVALID;
    }

    GLFONSstash* stash = new GLFONSstash;

    stash->offset = buffer->interleavedArray.size();

    // pre-allocate data for this text id
    int oldSize = buffer->interleavedArray.size();
    buffer->interleavedArray.resize(oldSize + gl->layout.nbComponents * ctx->nverts, 0);

    float inf = std::numeric_limits<float>::infinity();
    float x0 = inf, x1 = -inf, y0 = inf, y1 = -inf;

    for(int i = 0, index = oldSize; i < ctx->nverts * 2; i += 2) {
        float x, y;

        x = ctx->verts[i];
        y = ctx->verts[i + 1];

        x0 = x < x0 ? x : x0;
        x1 = x > x1 ? x : x1;
        y0 = y < y0 ? y : y0;
        y1 = y > y1 ? y : y1;

        buffer->interleavedArray[index++] = x;
        buffer->interleavedArray[index++] = y;
        buffer->interleavedArray[index++] = ctx->tcoords[i];
        buffer->interleavedArray[index++] = ctx->tcoords[i + 1];
        index += 4; // skip screenPos / alpha / rotation
    }

    // remove extra-offset used for interpolation in fontstash
    stash->bbox[0] = x0 + 3;
    stash->bbox[1] = y0 - 3;
    stash->bbox[2] = x1 + 3;
    stash->bbox[3] = y1 - 3;

    stash->length = length - 6;

    if(ctx->shaping != NULL && fons__getState(ctx)->useShaping) {
        FONSshapingRes* res = ctx->shaping->result;
        stash->nbGlyph = res->glyphCount;
        fons__clearShaping(ctx);
    } else {
        const char* str = s;
        const char* end = s + strlen(s);
        int i = 0;
        unsigned int utf8state = 0;
        unsigned int codepoint = 0;

        // count glyphs
        for (; str != end; ++str) {
            if (fons__decutf8(&utf8state, &codepoint, *(const unsigned char*)str))
                continue;
            i++;
        }
        stash->nbGlyph = i;
    }

    stash->padding = stash->nbGlyph * GLYPH_VERTS * gl->layout.nbComponents;

    // hack : reset fontstash state
    buffer->nVerts += ctx->nverts;
    ctx->nverts = 0;

    buffer->stashes[textId] = stash;

    return GLFONS_VALID;
}